

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dataset.cpp
# Opt level: O1

void randomx::initDatasetItem(randomx_cache *cache,uint8_t *out,uint64_t itemNumber)

{
  uint8_t *puVar1;
  uint q;
  long lVar2;
  uint i;
  long lVar3;
  undefined1 auVar4 [16];
  ulong local_78 [2];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  ulong local_48;
  ulong uStack_40;
  
  local_78[0] = itemNumber * 0x5851f42d4c957f2d + 0x5851f42d4c957f2d;
  local_78[1] = local_78[0] ^ 0x810a978a59f5a1fc;
  auVar4._8_4_ = (int)local_78[0];
  auVar4._0_8_ = local_78[0];
  auVar4._12_4_ = (int)(local_78[0] >> 0x20);
  local_68 = _DAT_0012b960 ^ auVar4;
  local_58 = auVar4 ^ _DAT_0012b970;
  local_48 = local_78[0] ^ 0x2f2a56746ce62d78;
  uStack_40 = local_78[0] ^ 0x84853bf7b62ce54e;
  lVar3 = 0;
  do {
    puVar1 = cache->memory;
    executeSuperscalar((int_reg_t (*) [8])local_78,cache->programs + lVar3,&cache->reciprocalCache);
    lVar2 = 0;
    do {
      local_78[lVar2] =
           local_78[lVar2] ^
           *(ulong *)(puVar1 + lVar2 * 8 + (ulong)(((uint)itemNumber & 0x3fffff) << 6));
      lVar2 = lVar2 + 1;
    } while (lVar2 != 8);
    itemNumber = local_78[cache->programs[lVar3].addrReg];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 8);
  *(ulong *)(out + 0x30) = local_48;
  *(ulong *)(out + 0x38) = uStack_40;
  *(undefined8 *)(out + 0x20) = local_58._0_8_;
  *(undefined8 *)(out + 0x28) = local_58._8_8_;
  *(undefined8 *)(out + 0x10) = local_68._0_8_;
  *(undefined8 *)(out + 0x18) = local_68._8_8_;
  *(ulong *)out = local_78[0];
  *(ulong *)(out + 8) = local_78[1];
  return;
}

Assistant:

void initDatasetItem(randomx_cache* cache, uint8_t* out, uint64_t itemNumber) {
		int_reg_t rl[8];
		uint8_t* mixBlock;
		uint64_t registerValue = itemNumber;
		rl[0] = (itemNumber + 1) * superscalarMul0;
		rl[1] = rl[0] ^ superscalarAdd1;
		rl[2] = rl[0] ^ superscalarAdd2;
		rl[3] = rl[0] ^ superscalarAdd3;
		rl[4] = rl[0] ^ superscalarAdd4;
		rl[5] = rl[0] ^ superscalarAdd5;
		rl[6] = rl[0] ^ superscalarAdd6;
		rl[7] = rl[0] ^ superscalarAdd7;
		for (unsigned i = 0; i < RANDOMX_CACHE_ACCESSES; ++i) {
			mixBlock = getMixBlock(registerValue, cache->memory);
			rx_prefetch_nta(mixBlock);
			SuperscalarProgram& prog = cache->programs[i];

			executeSuperscalar(rl, prog, &cache->reciprocalCache);

			for (unsigned q = 0; q < 8; ++q)
				rl[q] ^= load64_native(mixBlock + 8 * q);

			registerValue = rl[prog.getAddressRegister()];
		}

		memcpy(out, &rl, CacheLineSize);
	}